

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<kj::String> __thiscall
kj::Promise<kj::String>::attach<kj::HttpClient::Response>
          (Promise<kj::String> *this,Response *attachments)

{
  PromiseNode *pPVar1;
  AsyncInputStream *pAVar2;
  undefined8 *in_RDX;
  PromiseNode *local_60;
  Response local_58;
  
  local_58._0_8_ = *in_RDX;
  local_58.statusText.content.ptr = (char *)in_RDX[1];
  local_58.statusText.content.size_ = in_RDX[2];
  local_58.headers = (HttpHeaders *)in_RDX[3];
  local_58.body.disposer = (Disposer *)in_RDX[4];
  local_58.body.ptr = (AsyncInputStream *)in_RDX[5];
  in_RDX[5] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,kj::_::PromiseDisposer,kj::HttpClient::Response>
            ((PromiseDisposer *)&local_60,(OwnPromiseNode *)attachments,&local_58);
  pAVar2 = local_58.body.ptr;
  pPVar1 = local_60;
  local_60 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar1;
  if (local_58.body.ptr != (AsyncInputStream *)0x0) {
    local_58.body.ptr = (AsyncInputStream *)0x0;
    (**(local_58.body.disposer)->_vptr_Disposer)
              (local_58.body.disposer,
               pAVar2->_vptr_AsyncInputStream[-2] + (long)&pAVar2->_vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}